

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcMapping.c
# Opt level: O3

void Sparc_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  uint uVar3;
  long lVar4;
  cs_detail *pcVar5;
  
  uVar2 = insn_find(insns,0x1b9,id,&h->insn_cache);
  if (uVar2 != 0) {
    insn->id = (uint)insns[uVar2].mapid;
    if (h->detail != CS_OPT_OFF) {
      pcVar5 = insn->detail;
      *(undefined4 *)(pcVar5->regs_read + 8) = *(undefined4 *)(insns[uVar2].regs_use + 8);
      *(undefined8 *)pcVar5->regs_read = *(undefined8 *)insns[uVar2].regs_use;
      uVar3 = count_positive(insns[uVar2].regs_use);
      pcVar5 = insn->detail;
      pcVar5->regs_read_count = (uint8_t)uVar3;
      *(undefined4 *)(pcVar5->regs_write + 0x10) = *(undefined4 *)(insns[uVar2].regs_mod + 0x10);
      uVar1 = *(undefined8 *)(insns[uVar2].regs_mod + 8);
      *(undefined8 *)pcVar5->regs_write = *(undefined8 *)insns[uVar2].regs_mod;
      *(undefined8 *)(pcVar5->regs_write + 8) = uVar1;
      uVar3 = count_positive(insns[uVar2].regs_mod);
      pcVar5 = insn->detail;
      pcVar5->regs_write_count = (uint8_t)uVar3;
      *(undefined8 *)pcVar5->groups = *(undefined8 *)insns[uVar2].groups;
      uVar3 = count_positive(insns[uVar2].groups);
      pcVar5 = insn->detail;
      pcVar5->groups_count = (uint8_t)uVar3;
      if ((insns[uVar2].branch != false) || (insns[uVar2].indirect_branch == true)) {
        pcVar5->groups[uVar3 & 0xff] = '\x01';
        pcVar5 = insn->detail;
        pcVar5->groups_count = pcVar5->groups_count + '\x01';
      }
      lVar4 = 0;
      do {
        if (insn_hints[lVar4].id == id) {
          *(uint *)((long)&pcVar5->field_6 + 4) = (uint)insn_hints[lVar4].hints;
          return;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x12);
    }
  }
  return;
}

Assistant:

void Sparc_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned short i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = SPARC_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
			// hint code
			for (i = 0; i < ARR_SIZE(insn_hints); i++) {
				if (id == insn_hints[i].id) {
					insn->detail->sparc.hint = insn_hints[i].hints;
					break;
				}
			}
		}
	}
}